

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splayinsert(curltime i,Curl_tree *t,Curl_tree *node)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  Curl_tree *pCVar5;
  timediff_t tVar6;
  ulong uVar7;
  curltime i_00;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  uVar7 = i._8_8_;
  i_00.tv_sec = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    pCVar5 = (Curl_tree *)0x0;
  }
  else {
    i_00._8_8_ = uVar7 & 0xffffffff;
    pCVar5 = Curl_splay(i_00,t);
    uVar1 = (pCVar5->key).tv_sec;
    uVar2 = (pCVar5->key).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._8_8_ = uVar7 & 0xffffffff;
    newer.tv_sec = i_00.tv_sec;
    older._12_4_ = 0;
    tVar6 = Curl_timediff_us(newer,older);
    if (tVar6 == 0) {
      *(undefined4 *)&(node->key).tv_sec = 0xffffffff;
      *(undefined4 *)((long)&(node->key).tv_sec + 4) = 0xffffffff;
      (node->key).tv_usec = -1;
      *(undefined4 *)&(node->key).field_0xc = 0xffffffff;
      node->samen = pCVar5;
      node->samep = pCVar5->samep;
      pCVar5->samep->samen = node;
      goto LAB_00159f39;
    }
  }
  if (pCVar5 == (Curl_tree *)0x0) {
    node->smaller = (Curl_tree *)0x0;
    node->larger = (Curl_tree *)0x0;
  }
  else {
    uVar3 = (pCVar5->key).tv_sec;
    uVar4 = (pCVar5->key).tv_usec;
    older_00.tv_usec = uVar4;
    older_00.tv_sec = uVar3;
    newer_00._8_8_ = uVar7 & 0xffffffff;
    newer_00.tv_sec = i_00.tv_sec;
    older_00._12_4_ = 0;
    tVar6 = Curl_timediff_us(newer_00,older_00);
    if (tVar6 < 0) {
      node->smaller = pCVar5->smaller;
      node->larger = pCVar5;
      pCVar5->smaller = (Curl_tree *)0x0;
    }
    else {
      node->larger = pCVar5->larger;
      node->smaller = pCVar5;
      pCVar5->larger = (Curl_tree *)0x0;
    }
  }
  (node->key).tv_sec = i_00.tv_sec;
  (node->key).tv_usec = i.tv_usec;
  node->samen = node;
  pCVar5 = node;
LAB_00159f39:
  pCVar5->samep = node;
  return pCVar5;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct curltime i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */

  DEBUGASSERT(node);

  if(t) {
    t = Curl_splay(i, t);
    DEBUGASSERT(t);
    if(compare(i, t->key) == 0) {
      /* There already exists a node in the tree with the very same key. Build
         a doubly-linked circular list of nodes. We add the new 'node' struct
         to the end of this list. */

      node->key = KEY_NOTUSED; /* we set the key in the sub node to NOTUSED
                                  to quickly identify this node as a subnode */
      node->samen = t;
      node->samep = t->samep;
      t->samep->samen = node;
      t->samep = node;

      return t; /* the root node always stays the same */
    }
  }

  if(!t) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  /* no identical nodes (yet), we are the only one in the list of nodes */
  node->samen = node;
  node->samep = node;
  return node;
}